

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::finishSendingError(Connection *this,Promise<void> *promise)

{
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  HttpOutputStream *this_01;
  SourceLocation location;
  bool bVar1;
  coroutine_handle<void> handle;
  undefined8 *in_RDX;
  PromiseAwaiter<void> *pPVar2;
  
  handle._M_fr_ptr = operator_new(0x5c8);
  *(code **)handle._M_fr_ptr = finishSendingError;
  *(code **)((long)handle._M_fr_ptr + 8) = finishSendingError;
  *(Promise<void> **)((long)handle._M_fr_ptr + 0x5b8) = promise;
  *(undefined8 *)((long)handle._M_fr_ptr + 0x5a8) = *in_RDX;
  *in_RDX = 0;
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)((long)handle._M_fr_ptr + 0x10);
  location.function = "finishSendingError";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1f6e;
  location.columnNumber = 0x1b;
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::get_return_object
            ((Coroutine<kj::HttpServer::Connection::LoopResult> *)this);
  pPVar2 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
  co_await<void>(pPVar2,(Promise<void> *)((long)handle._M_fr_ptr + 0x5a8));
  *(undefined1 *)((long)handle._M_fr_ptr + 0x5c0) = 0;
  bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
  if (!bVar1) {
    kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar2);
    if (*(char *)(*(long *)((long)handle._M_fr_ptr + 0x5b8) + 0x141) == '\0') {
      this_01 = (HttpOutputStream *)((long)handle._M_fr_ptr + 0x5b0);
      anon_unknown_36::HttpOutputStream::flush(this_01);
      pPVar2 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x3f0);
      co_await<void>(pPVar2,(Promise<void> *)this_01);
      *(undefined1 *)((long)handle._M_fr_ptr + 0x5c0) = 1;
      bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
      if (bVar1) {
        return (PromiseBase)(PromiseBase)this;
      }
      kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar2);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
    }
    kj::_::
    CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
    ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                    *)this_00,BREAK_LOOP_CONN_ERR);
    *(undefined8 *)handle._M_fr_ptr = 0;
    *(undefined1 *)((long)handle._M_fr_ptr + 0x5c0) = 2;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> finishSendingError(kj::Promise<void> promise) {
    co_await promise;
    if (!httpOutput.isBroken()) {
      // Skip flush for broken streams, since it will throw an exception that may be worse than
      // the one we just handled.
      co_await httpOutput.flush();
    }
    co_return BREAK_LOOP_CONN_ERR;
  }